

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

PagesConfig * __thiscall QPDFJob::PagesConfig::password(PagesConfig *this,string *arg)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  pointer pPVar4;
  string local_48;
  
  peVar1 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pPVar4 = *(pointer *)
            ((long)&(peVar1->page_specs).
                    super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if ((peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar4) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"in --pages, --password must follow a file name","");
    usage(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pPVar4 = *(pointer *)
              ((long)&(((this->config->o->m).
                        super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
  }
  if (pPVar4[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"--password already specified for this file","");
    usage(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  QUtil::make_shared_cstr((QUtil *)&local_48,arg);
  sVar3 = local_48._M_string_length;
  _Var2._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  this_00 = pPVar4[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  pPVar4[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _Var2._M_p;
  pPVar4[-1].password.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
  }
  return this;
}

Assistant:

QPDFJob::PagesConfig*
QPDFJob::PagesConfig::password(std::string const& arg)
{
    if (config->o.m->page_specs.empty()) {
        QTC::TC("qpdf", "QPDFJob misplaced pages password");
        usage("in --pages, --password must follow a file name");
    }
    auto& last = config->o.m->page_specs.back();
    if (last.password) {
        QTC::TC("qpdf", "QPDFJob duplicated pages password");
        usage("--password already specified for this file");
    }
    last.password = QUtil::make_shared_cstr(arg);
    return this;
}